

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AccountID.cpp
# Opt level: O1

string * __thiscall
jbcoin::AccountIDCache::toBase58_abi_cxx11_
          (string *__return_storage_ptr__,AccountIDCache *this,AccountID *id)

{
  hash_map<AccountID,_std::string> *this_00;
  hash_map<AccountID,_std::string> *this_01;
  int iVar1;
  iterator iVar2;
  undefined1 in_R9B;
  __hashtable *__this;
  double dVar3;
  string local_50;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    this_00 = &this->m1_;
    iVar2 = std::
            _Hashtable<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::pair<const_jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_>,_beast::uhash<beast::spooky>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&this_00->_M_h,id);
    if (iVar2.
        super__Node_iterator_base<std::pair<const_jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      this_01 = &this->m0_;
      iVar2 = std::
              _Hashtable<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::pair<const_jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_>,_beast::uhash<beast::spooky>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&this_01->_M_h,id);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      if (iVar2.
          super__Node_iterator_base<std::pair<const_jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
          ._M_cur == (__node_type *)0x0) {
        encodeToken_abi_cxx11_(&local_50,(jbcoin *)0x0,(uint8_t)id,(void *)0x14,0,(bool)in_R9B);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
        std::
        _Hashtable<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::pair<const_jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_>,_beast::uhash<beast::spooky>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::erase(&this_01->_M_h,
                (const_iterator)
                iVar2.
                super__Node_iterator_base<std::pair<const_jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                ._M_cur);
      }
      if (this->capacity_ <= (this->m1_)._M_h._M_element_count) {
        std::
        _Hashtable<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::pair<const_jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_>,_beast::uhash<beast::spooky>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::_M_move_assign(&this_01->_M_h,this_00);
        std::
        _Hashtable<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::pair<const_jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_>,_beast::uhash<beast::spooky>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::clear(&this_00->_M_h);
        dVar3 = ceil((((double)CONCAT44(0x45300000,(int)(this->capacity_ >> 0x20)) -
                      1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)this->capacity_) - 4503599627370496.0)) /
                     (double)(this->m1_)._M_h._M_rehash_policy._M_max_load_factor);
        std::
        _Hashtable<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::pair<const_jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_>,_beast::uhash<beast::spooky>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::rehash(&this_00->_M_h,
                 (long)(dVar3 - 9.223372036854776e+18) & (long)dVar3 >> 0x3f | (long)dVar3);
      }
      std::
      _Hashtable<jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>,std::pair<jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>const,std::__cxx11::string>,std::allocator<std::pair<jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>>,beast::uhash<beast::spooky>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_emplace<jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>const&,std::__cxx11::string&>
                ((_Hashtable<jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>,std::pair<jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>const,std::__cxx11::string>,std::allocator<std::pair<jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>>,beast::uhash<beast::spooky>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)this_00,id,__return_storage_ptr__);
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,
                 *(long *)((long)iVar2.
                                 super__Node_iterator_base<std::pair<const_jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                 ._M_cur + 0x20),
                 *(long *)((long)iVar2.
                                 super__Node_iterator_base<std::pair<const_jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                 ._M_cur + 0x28) +
                 *(long *)((long)iVar2.
                                 super__Node_iterator_base<std::pair<const_jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                 ._M_cur + 0x20));
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return __return_storage_ptr__;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

std::string
AccountIDCache::toBase58(
    AccountID const& id) const
{
    std::lock_guard<
        std::mutex> lock(mutex_);
    auto iter = m1_.find(id);
    if (iter != m1_.end())
        return iter->second;
    iter = m0_.find(id);
    std::string result;
    if (iter != m0_.end())
    {
        result = iter->second;
        // Can use insert-only hash maps if
        // we didn't erase from here.
        m0_.erase(iter);
    }
    else
    {
        result =
            jbcoin::toBase58(id);
    }
    if (m1_.size() >= capacity_)
    {
        m0_ = std::move(m1_);
        m1_.clear();
        m1_.reserve(capacity_);
    }
    m1_.emplace(id, result);
    return result;
}